

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DualStringMappedVector.hpp
# Opt level: O0

BlockIterator<helics::Endpoint,_32,_helics::Endpoint_**> * __thiscall
gmlc::containers::
DualStringMappedVector<helics::Endpoint,_helics::InterfaceHandle,_(reference_stability)0,_5>::find
          (DualStringMappedVector<helics::Endpoint,_helics::InterfaceHandle,_(reference_stability)0,_5>
           *this,InterfaceHandle *searchValue)

{
  bool bVar1;
  BlockIterator<helics::Endpoint,_32,_helics::Endpoint_**> *in_RDI;
  iterator fnd;
  BlockIterator<helics::Endpoint,_32,_helics::Endpoint_**> *this_00;
  StableBlockVector<helics::Endpoint,_5U,_std::allocator<helics::Endpoint>_>
  *in_stack_ffffffffffffffc0;
  StableBlockVector<helics::Endpoint,_5U,_std::allocator<helics::Endpoint>_>
  *in_stack_ffffffffffffffd0;
  _Node_iterator_base<std::pair<const_helics::InterfaceHandle,_unsigned_long>,_false> local_20;
  _Node_iterator_base<std::pair<const_helics::InterfaceHandle,_unsigned_long>,_false> local_18 [3];
  
  this_00 = in_RDI;
  local_18[0]._M_cur =
       (__node_type *)
       std::
       unordered_map<helics::InterfaceHandle,_unsigned_long,_std::hash<helics::InterfaceHandle>,_std::equal_to<helics::InterfaceHandle>,_std::allocator<std::pair<const_helics::InterfaceHandle,_unsigned_long>_>_>
       ::find((unordered_map<helics::InterfaceHandle,_unsigned_long,_std::hash<helics::InterfaceHandle>,_std::equal_to<helics::InterfaceHandle>,_std::allocator<std::pair<const_helics::InterfaceHandle,_unsigned_long>_>_>
               *)in_RDI,(key_type *)0x2bb322);
  local_20._M_cur =
       (__node_type *)
       std::
       unordered_map<helics::InterfaceHandle,_unsigned_long,_std::hash<helics::InterfaceHandle>,_std::equal_to<helics::InterfaceHandle>,_std::allocator<std::pair<const_helics::InterfaceHandle,_unsigned_long>_>_>
       ::end((unordered_map<helics::InterfaceHandle,_unsigned_long,_std::hash<helics::InterfaceHandle>,_std::equal_to<helics::InterfaceHandle>,_std::allocator<std::pair<const_helics::InterfaceHandle,_unsigned_long>_>_>
              *)in_RDI);
  bVar1 = std::__detail::operator==(local_18,&local_20);
  if (((bVar1 ^ 0xffU) & 1) == 0) {
    StableBlockVector<helics::Endpoint,_5U,_std::allocator<helics::Endpoint>_>::end
              (in_stack_ffffffffffffffd0);
  }
  else {
    StableBlockVector<helics::Endpoint,_5U,_std::allocator<helics::Endpoint>_>::begin
              (in_stack_ffffffffffffffc0);
    std::__detail::
    _Node_iterator<std::pair<const_helics::InterfaceHandle,_unsigned_long>,_false,_false>::
    operator->((_Node_iterator<std::pair<const_helics::InterfaceHandle,_unsigned_long>,_false,_false>
                *)0x2bb36d);
    BlockIterator<helics::Endpoint,_32,_helics::Endpoint_**>::operator+(this_00,(ptrdiff_t *)in_RDI)
    ;
  }
  return this_00;
}

Assistant:

auto find(const searchType2& searchValue)
        {
            auto fnd = lookup2.find(searchValue);
            if (fnd != lookup2.end()) {
                return dataStorage.begin() + fnd->second;
            }
            return dataStorage.end();
        }